

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QWidget_*,_QPersistentModelIndex>::emplace_helper<QPersistentModelIndex>
          (QHash<QWidget_*,_QPersistentModelIndex> *this,QWidget **key,QPersistentModelIndex *args)

{
  byte bVar1;
  Entry *pEVar2;
  QPersistentModelIndexData *pQVar3;
  piter pVar4;
  long in_FS_OFFSET;
  QPersistentModelIndex local_40;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QWidget*,QPersistentModelIndex>>::findOrInsert<QWidget*>
            ((InsertionResult *)local_38,
             (Data<QHashPrivate::Node<QWidget*,QPersistentModelIndex>> *)this->d,key);
  pEVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    *(QWidget **)pEVar2[bVar1].storage.data = *key;
    pQVar3 = args->d;
    args->d = (QPersistentModelIndexData *)0x0;
    *(QPersistentModelIndexData **)(pEVar2[bVar1].storage.data + 8) = pQVar3;
  }
  else {
    pQVar3 = args->d;
    args->d = (QPersistentModelIndexData *)0x0;
    local_40.d = *(QPersistentModelIndexData **)(pEVar2[bVar1].storage.data + 8);
    *(QPersistentModelIndexData **)(pEVar2[bVar1].storage.data + 8) = pQVar3;
    QPersistentModelIndex::~QPersistentModelIndex(&local_40);
  }
  pVar4.bucket = local_38._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }